

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moderation.cpp
# Opt level: O0

void Commands::Ban(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *arguments,Command_Source *from,bool announce)

{
  Command_Source *from_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  const_reference pvVar3;
  Character *pCVar4;
  size_type sVar5;
  undefined4 extraout_var_00;
  mapped_type *this;
  double dVar6;
  anon_class_4_1_71307312 local_e4;
  function<void_(World_*,_Command_Source_*,_Character_*,_bool)> local_e0;
  allocator<char> local_b9;
  key_type local_b8;
  string local_98;
  string local_78;
  int local_58;
  int duration;
  string local_48;
  Character *local_28;
  Character *victim;
  Command_Source *pCStack_18;
  bool announce_local;
  Command_Source *from_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *arguments_local;
  
  victim._7_1_ = announce;
  pCStack_18 = from;
  from_local = (Command_Source *)arguments;
  iVar2 = (*from->_vptr_Command_Source[4])();
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)from_local,0);
  std::__cxx11::string::string((string *)&local_48,(string *)pvVar3);
  pCVar4 = World::GetCharacter((World *)CONCAT44(extraout_var,iVar2),&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  local_58 = -1;
  local_28 = pCVar4;
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)from_local);
  if (sVar5 < 2) {
    iVar2 = (*pCStack_18->_vptr_Command_Source[4])();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"DefaultBanLength",&local_b9);
    this = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                         *)(CONCAT44(extraout_var_00,iVar2) + 0x198),&local_b8);
    util::variant::operator_cast_to_string(&local_98,this);
    dVar6 = util::tdparse(&local_98);
    local_58 = (int)dVar6;
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
  }
  else {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)from_local,1);
    util::lowercase(&local_78,pvVar3);
    bVar1 = std::operator!=(&local_78,"forever");
    std::__cxx11::string::~string((string *)&local_78);
    if (bVar1) {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)from_local,1);
      dVar6 = util::tdparse(pvVar3);
      local_58 = (int)dVar6;
    }
  }
  from_00 = pCStack_18;
  pCVar4 = local_28;
  local_e4.duration = local_58;
  std::function<void(World*,Command_Source*,Character*,bool)>::
  function<Commands::Ban(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,Command_Source*,bool)::__0,void>
            ((function<void(World*,Command_Source*,Character*,bool)> *)&local_e0,&local_e4);
  do_punishment(from_00,pCVar4,&local_e0,(bool)(victim._7_1_ & 1));
  std::function<void_(World_*,_Command_Source_*,_Character_*,_bool)>::~function(&local_e0);
  return;
}

Assistant:

void Ban(const std::vector<std::string>& arguments, Command_Source* from, bool announce = true)
{
	Character* victim = from->SourceWorld()->GetCharacter(arguments[0]);
	int duration = -1;

	if (arguments.size() >= 2)
	{
		if (util::lowercase(arguments[1]) != "forever")
			duration = int(util::tdparse(arguments[1]));
	}
	else
	{
		duration = int(util::tdparse(from->SourceWorld()->config["DefaultBanLength"]));
	}

	do_punishment(from, victim, [duration](World* world, Command_Source* from, Character* victim, bool announce)
		{
			world->Ban(from, victim, duration, announce);
		}, announce);
}